

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O1

void __thiscall Assimp::RemoveVCProcess::Execute(RemoveVCProcess *this,aiScene *pScene)

{
  aiAnimation *this_00;
  aiTexture *paVar1;
  aiMaterial *paVar2;
  aiMesh *this_01;
  bool bVar3;
  Logger *pLVar4;
  bool bVar5;
  ulong uVar6;
  aiColor3D clr;
  aiString s;
  undefined8 local_440;
  undefined4 local_438;
  aiString local_434;
  
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"RemoveVCProcess begin");
  this->mScene = pScene;
  if ((this->configDeleteFlags & 0x40) == 0) {
    bVar3 = false;
    bVar5 = false;
  }
  else {
    if (pScene->mNumAnimations != 0) {
      uVar6 = 0;
      do {
        this_00 = pScene->mAnimations[uVar6];
        if (this_00 != (aiAnimation *)0x0) {
          aiAnimation::~aiAnimation(this_00);
          operator_delete(this_00);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumAnimations);
    }
    if (pScene->mAnimations != (aiAnimation **)0x0) {
      operator_delete__(pScene->mAnimations);
    }
    pScene->mAnimations = (aiAnimation **)0x0;
    pScene->mNumAnimations = 0;
    bVar3 = true;
    bVar5 = true;
  }
  if ((this->configDeleteFlags & 0x80) != 0) {
    if (pScene->mNumTextures != 0) {
      uVar6 = 0;
      do {
        paVar1 = pScene->mTextures[uVar6];
        if (paVar1 != (aiTexture *)0x0) {
          if (paVar1->pcData != (aiTexel *)0x0) {
            operator_delete__(paVar1->pcData);
          }
          operator_delete(paVar1);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumTextures);
    }
    if (pScene->mTextures != (aiTexture **)0x0) {
      operator_delete__(pScene->mTextures);
    }
    pScene->mTextures = (aiTexture **)0x0;
    pScene->mNumTextures = 0;
    bVar3 = true;
    bVar5 = true;
  }
  if (((this->configDeleteFlags & 0x800) != 0) && (pScene->mNumMaterials != 0)) {
    if (1 < pScene->mNumMaterials) {
      uVar6 = 1;
      do {
        paVar2 = pScene->mMaterials[uVar6];
        if (paVar2 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(paVar2);
          operator_delete(paVar2);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumMaterials);
    }
    pScene->mNumMaterials = 1;
    paVar2 = *pScene->mMaterials;
    if (paVar2 == (aiMaterial *)0x0) {
      __assert_fail("__null != helper",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/RemoveVCProcess.cpp"
                    ,0xb1,"virtual void Assimp::RemoveVCProcess::Execute(aiScene *)");
    }
    aiMaterial::Clear(paVar2);
    local_440 = 0x3f19999a3f19999a;
    local_438 = 0x3f19999a;
    aiMaterial::AddBinaryProperty(paVar2,&local_440,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    local_440 = 0x3d4ccccd3d4ccccd;
    local_438 = 0x3d4ccccd;
    aiMaterial::AddBinaryProperty(paVar2,&local_440,0xc,"$clr.ambient",0,0,aiPTI_Float);
    local_434.length = 0;
    local_434.data._0_8_ = local_434.data._0_8_ & 0xffffffffffffff00;
    memset(local_434.data + 1,0x1b,0x3ff);
    local_434.length = 0x16;
    builtin_strncpy(local_434.data + 0x10,"emoved",7);
    builtin_strncpy(local_434.data,"Dummy_MaterialsR",0x10);
    aiMaterial::AddProperty(paVar2,&local_434,"?mat.name",0,0);
    bVar3 = true;
    bVar5 = true;
  }
  if ((this->configDeleteFlags & 0x100) != 0) {
    if (pScene->mNumLights != 0) {
      uVar6 = 0;
      do {
        if (pScene->mLights[uVar6] != (aiLight *)0x0) {
          operator_delete(pScene->mLights[uVar6]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumLights);
    }
    if (pScene->mLights != (aiLight **)0x0) {
      operator_delete__(pScene->mLights);
    }
    pScene->mLights = (aiLight **)0x0;
    pScene->mNumLights = 0;
    bVar3 = true;
    bVar5 = true;
  }
  if ((this->configDeleteFlags & 0x200) != 0) {
    if (pScene->mNumCameras != 0) {
      uVar6 = 0;
      do {
        if (pScene->mCameras[uVar6] != (aiCamera *)0x0) {
          operator_delete(pScene->mCameras[uVar6]);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumCameras);
    }
    if (pScene->mCameras != (aiCamera **)0x0) {
      operator_delete__(pScene->mCameras);
    }
    pScene->mCameras = (aiCamera **)0x0;
    pScene->mNumCameras = 0;
    bVar3 = true;
    bVar5 = true;
  }
  if ((this->configDeleteFlags & 0x400) == 0) {
    if (pScene->mNumMeshes != 0) {
      uVar6 = 0;
      bVar5 = bVar3;
      do {
        bVar3 = ProcessMesh(this,pScene->mMeshes[uVar6]);
        if (bVar3) {
          bVar5 = true;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumMeshes);
    }
  }
  else {
    if (pScene->mNumMeshes != 0) {
      uVar6 = 0;
      do {
        this_01 = pScene->mMeshes[uVar6];
        if (this_01 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(this_01);
          operator_delete(this_01);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < pScene->mNumMeshes);
    }
    if (pScene->mMeshes != (aiMesh **)0x0) {
      operator_delete__(pScene->mMeshes);
    }
    pScene->mMeshes = (aiMesh **)0x0;
    pScene->mNumMeshes = 0;
    bVar5 = true;
  }
  if ((pScene->mNumMeshes == 0) || (pScene->mNumMaterials == 0)) {
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    pLVar4 = DefaultLogger::get();
    Logger::debug(pLVar4,"Setting AI_SCENE_FLAGS_INCOMPLETE flag");
    if (pScene->mNumMeshes == 0) {
      *(byte *)&pScene->mFlags = (byte)pScene->mFlags & 0xf7;
    }
  }
  pLVar4 = DefaultLogger::get();
  if (bVar5) {
    Logger::info(pLVar4,"RemoveVCProcess finished. Data structure cleanup has been done.");
  }
  else {
    Logger::debug(pLVar4,"RemoveVCProcess finished. Nothing to be done ...");
  }
  return;
}

Assistant:

void RemoveVCProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveVCProcess begin");
    bool bHas = false; //,bMasked = false;

    mScene = pScene;

    // handle animations
    if ( configDeleteFlags & aiComponent_ANIMATIONS)
    {

        bHas = true;
        ArrayDelete(pScene->mAnimations,pScene->mNumAnimations);
    }

    // handle textures
    if ( configDeleteFlags & aiComponent_TEXTURES)
    {
        bHas = true;
        ArrayDelete(pScene->mTextures,pScene->mNumTextures);
    }

    // handle materials
    if ( configDeleteFlags & aiComponent_MATERIALS && pScene->mNumMaterials)
    {
        bHas = true;
        for (unsigned int i = 1;i < pScene->mNumMaterials;++i)
            delete pScene->mMaterials[i];

        pScene->mNumMaterials = 1;
        aiMaterial* helper = (aiMaterial*) pScene->mMaterials[0];
        ai_assert(NULL != helper);
        helper->Clear();

        // gray
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // add a small ambient color value
        clr = aiColor3D(0.05f,0.05f,0.05f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);

        aiString s;
        s.Set("Dummy_MaterialsRemoved");
        helper->AddProperty(&s,AI_MATKEY_NAME);
    }

    // handle light sources
    if ( configDeleteFlags & aiComponent_LIGHTS)
    {
        bHas =  true;
        ArrayDelete(pScene->mLights,pScene->mNumLights);
    }

    // handle camneras
    if ( configDeleteFlags & aiComponent_CAMERAS)
    {
        bHas = true;
        ArrayDelete(pScene->mCameras,pScene->mNumCameras);
    }

    // handle meshes
    if (configDeleteFlags & aiComponent_MESHES)
    {
        bHas = true;
        ArrayDelete(pScene->mMeshes,pScene->mNumMeshes);
    }
    else
    {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        {
            if( ProcessMesh( pScene->mMeshes[a]))
                bHas = true;
        }
    }


    // now check whether the result is still a full scene
    if (!pScene->mNumMeshes || !pScene->mNumMaterials)
    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        ASSIMP_LOG_DEBUG("Setting AI_SCENE_FLAGS_INCOMPLETE flag");

        // If we have no meshes anymore we should also clear another flag ...
        if (!pScene->mNumMeshes)
            pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
    }

    if (bHas) {
        ASSIMP_LOG_INFO("RemoveVCProcess finished. Data structure cleanup has been done.");
    } else {
        ASSIMP_LOG_DEBUG("RemoveVCProcess finished. Nothing to be done ...");
    }
}